

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool removeLowSimilarityKeys<short>
               (TKeyPressCollectionT<short> *keyPresses,TSimilarityMap *sim,double threshold)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference this;
  reference pvVar4;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RSI;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_RDI;
  double in_XMM0_Qa;
  reference rVar5;
  reference rVar6;
  int i_4;
  TSimilarityMap sim0;
  int j_1;
  value_type cur;
  int i_3;
  int i_2;
  TKeyPressCollectionT<short> keyPresses0;
  int i_1;
  int nRemoved;
  int j;
  int i;
  vector<bool,_std::allocator<bool>_> used;
  int n;
  stKeyPressCollection<short> *in_stack_fffffffffffffdf8;
  stKeyPressCollection<short> *in_stack_fffffffffffffe00;
  value_type *in_stack_fffffffffffffe08;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_stack_fffffffffffffe10;
  reference in_stack_fffffffffffffe18;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe20;
  _Bit_type in_stack_fffffffffffffe48;
  _Bit_type *in_stack_fffffffffffffe50;
  reference local_160;
  int local_14c;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  local_148;
  reference local_130;
  int local_11c;
  vector<stMatch,_std::allocator<stMatch>_> local_118;
  int local_fc;
  reference local_f8;
  int local_e4;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> local_e0;
  undefined4 local_bc;
  reference local_b8;
  int local_a8;
  int local_a4;
  reference local_a0;
  reference local_90;
  int local_7c;
  reference local_78;
  int local_68;
  undefined1 local_51;
  int local_24;
  double local_20;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_18;
  byte local_1;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  sVar2 = std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::size(in_RDI);
  local_24 = (int)sVar2;
  sVar3 = std::
          vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ::size(local_18);
  if ((int)sVar2 == (int)sVar3) {
    local_51 = 0;
    std::allocator<bool>::allocator((allocator<bool> *)0x13b08f);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
               (bool *)in_stack_fffffffffffffe10,(allocator_type *)in_stack_fffffffffffffe08);
    std::allocator<bool>::~allocator((allocator<bool> *)0x13b0c3);
    local_68 = 0;
    while( true ) {
      rVar5._M_mask = in_stack_fffffffffffffe48;
      rVar5._M_p = in_stack_fffffffffffffe50;
      if (local_24 <= local_68) break;
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
      local_78 = rVar5;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_78);
      if (!bVar1) {
        for (local_7c = 0; local_7c < local_24; local_7c = local_7c + 1) {
          if (local_68 != local_7c) {
            this = std::
                   vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   ::operator[](local_18,(long)local_68);
            pvVar4 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](this,(long)local_7c)
            ;
            if (local_20 < pvVar4->cc) {
              rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
              local_90 = rVar5;
              std::_Bit_reference::operator=(&local_90,true);
              rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
              local_a0 = rVar5;
              std::_Bit_reference::operator=(&local_a0,true);
              break;
            }
          }
        }
      }
      local_68 = local_68 + 1;
    }
    local_a4 = 0;
    local_a8 = 0;
    while( true ) {
      if (local_24 <= local_a8) break;
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
      local_b8 = rVar5;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_b8);
      if (!bVar1) {
        local_a4 = local_a4 + 1;
      }
      local_a8 = local_a8 + 1;
    }
    if (local_a4 == 0) {
      local_1 = 1;
      local_bc = 1;
    }
    else {
      stKeyPressCollection<short>::stKeyPressCollection
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::clear
                ((vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *)0x13b39b)
      ;
      for (local_e4 = 0; local_e4 < local_24; local_e4 = local_e4 + 1) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
        local_f8 = rVar6;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_f8);
        if (bVar1) {
          std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator[]
                    (&local_e0,(long)local_e4);
          std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::push_back
                    (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        }
      }
      local_fc = 0;
      while( true ) {
        if (local_24 <= local_fc) break;
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::operator[](local_18,(long)local_fc);
        std::vector<stMatch,_std::allocator<stMatch>_>::vector
                  ((vector<stMatch,_std::allocator<stMatch>_> *)rVar5._M_p,
                   (vector<stMatch,_std::allocator<stMatch>_> *)rVar5._M_mask);
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::operator[](local_18,(long)local_fc);
        std::vector<stMatch,_std::allocator<stMatch>_>::clear
                  ((vector<stMatch,_std::allocator<stMatch>_> *)0x13b4cf);
        for (local_11c = 0; local_11c < local_24; local_11c = local_11c + 1) {
          rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
          in_stack_fffffffffffffe20 = (vector<bool,_std::allocator<bool>_> *)rVar6._M_mask;
          local_130 = rVar6;
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_130);
          if (bVar1) {
            in_stack_fffffffffffffe18 =
                 std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](local_18,(long)local_fc);
            std::vector<stMatch,_std::allocator<stMatch>_>::operator[](&local_118,(long)local_11c);
            std::vector<stMatch,_std::allocator<stMatch>_>::push_back
                      ((vector<stMatch,_std::allocator<stMatch>_> *)in_stack_fffffffffffffe10,
                       (value_type *)in_stack_fffffffffffffe08);
          }
        }
        std::vector<stMatch,_std::allocator<stMatch>_>::~vector
                  ((vector<stMatch,_std::allocator<stMatch>_> *)in_stack_fffffffffffffe10);
        local_fc = local_fc + 1;
      }
      std::
      vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ::vector((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                *)rVar5._M_p,
               (vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                *)rVar5._M_mask);
      std::
      vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ::clear((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               *)0x13b601);
      rVar6._M_mask = (_Bit_type)in_stack_fffffffffffffe08;
      rVar6._M_p = (_Bit_type *)in_stack_fffffffffffffe10;
      for (local_14c = 0; local_14c < local_24; local_14c = local_14c + 1) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
        local_160 = rVar6;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_160);
        if (bVar1) {
          std::
          vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ::operator[](&local_148,(long)local_14c);
          std::
          vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ::push_back((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                       *)rVar6._M_p,(value_type *)rVar6._M_mask);
        }
      }
      local_1 = 1;
      local_bc = 1;
      std::
      vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ::~vector((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 *)rVar6._M_p);
      stKeyPressCollection<short>::~stKeyPressCollection((stKeyPressCollection<short> *)0x13b709);
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x13b727);
  }
  else {
    fprintf(_stderr,"removeLowSimilarityKeys: n != sim.size()\n");
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool removeLowSimilarityKeys(TKeyPressCollectionT<T> & keyPresses, TSimilarityMap & sim, double threshold) {
    const int n = keyPresses.size();
    if (n != (int) sim.size()) {
        fprintf(stderr, "removeLowSimilarityKeys: n != sim.size()\n");
        return false;
    }

    std::vector<bool> used(n, false);

    for (int i = 0; i < n; ++i) {
        if (used[i]) continue;

        for (int j = 0 ; j < n; ++j) {
            if (i == j) continue;

            if (sim[i][j].cc > threshold) {
                used[i] = true;
                used[j] = true;
                break;
            }
        }
    }

    int nRemoved = 0;
    for (int i = 0; i < n; ++i) {
        if (used[i]) continue;

        //keyPresses.erase(keyPresses.begin() + i - nRemoved);
        ++nRemoved;
    }

    if (nRemoved == 0) {
        return true;
    }

    auto keyPresses0 = keyPresses;
    keyPresses.clear();

    for (int i = 0; i < n; ++i) {
        if (used[i]) {
            keyPresses.push_back(keyPresses0[i]);
        }
    }

    for (int i = 0; i < n; ++i) {
        auto cur = sim[i];
        sim[i].clear();
        for (int j = 0; j < n; ++j) {
            if (used[j]) {
                sim[i].push_back(cur[j]);
            }
        }
    }

    auto sim0 = sim;
    sim.clear();
    for (int i = 0; i < n; ++i) {
        if (used[i]) {
            sim.push_back(sim0[i]);
        }
    }

    return true;
}